

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task26.cpp
# Opt level: O0

void resize(IntArray *arr,int newSize)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  int *piVar4;
  int local_28;
  int local_24;
  int i_1;
  int i;
  int *new_arr;
  IntArray *pIStack_10;
  int newSize_local;
  IntArray *arr_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)newSize;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  new_arr._4_4_ = newSize;
  pIStack_10 = arr;
  piVar3 = (int *)operator_new__(uVar2);
  for (local_24 = 0; piVar4 = std::min<int>((int *)((long)&new_arr + 4),&pIStack_10->size),
      local_24 < *piVar4; local_24 = local_24 + 1) {
    piVar3[local_24] = pIStack_10->data[local_24];
  }
  if (pIStack_10->data != (int *)0x0) {
    operator_delete__(pIStack_10->data);
  }
  pIStack_10->data = piVar3;
  if (pIStack_10->size < new_arr._4_4_) {
    for (local_28 = pIStack_10->size; local_28 < new_arr._4_4_; local_28 = local_28 + 1) {
      pIStack_10->data[local_28] = 0;
    }
  }
  pIStack_10->size = new_arr._4_4_;
  return;
}

Assistant:

void resize(IntArray* arr, int newSize){
    int* new_arr = new int [newSize];
    for (int i = 0; i < min(newSize, arr->size); i++) new_arr[i] = arr->data[i];
    delete[]arr->data;
    arr->data = new_arr;
    if (newSize > arr->size) for (int i = arr->size; i < newSize; i++) arr->data[i] = 0;
    arr->size = newSize;
}